

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

string * deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
         declareAndInitializeShaderVariable
                   (string *__return_storage_ptr__,DataType dataType,string *varName)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  ostringstream variable;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar1 = glu::getDataTypeName(dataType);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(varName->_M_dataplus)._M_p,varName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
  pcVar1 = glu::getDataTypeName(dataType);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,sVar2);
  }
  switch(dataType) {
  case TYPE_INT:
    lVar4 = 5;
    pcVar1 = "(1);\n";
    break;
  case TYPE_INT_VEC2:
    lVar4 = 8;
    pcVar1 = "(1, 1);\n";
    break;
  case TYPE_INT_VEC3:
    lVar4 = 0xb;
    pcVar1 = "(1, 1, 1);\n";
    break;
  case TYPE_INT_VEC4:
    lVar4 = 0xe;
    pcVar1 = "(1, 1, 1, 1);\n";
    break;
  case TYPE_UINT:
    lVar4 = 6;
    pcVar1 = "(1u);\n";
    break;
  case TYPE_UINT_VEC2:
    lVar4 = 10;
    pcVar1 = "(1u, 1u);\n";
    break;
  case TYPE_UINT_VEC3:
    lVar4 = 0xe;
    pcVar1 = "(1u, 1u, 1u);\n";
    break;
  case TYPE_UINT_VEC4:
    lVar4 = 0x12;
    pcVar1 = "(1u, 1u, 1u, 1u);\n";
    break;
  default:
    switch(dataType) {
    case TYPE_FLOAT:
      lVar4 = 7;
      pcVar1 = "(1.0);\n";
      break;
    case TYPE_FLOAT_VEC2:
      lVar4 = 0xc;
      pcVar1 = "(1.0, 1.0);\n";
      break;
    case TYPE_FLOAT_VEC3:
      lVar4 = 0x11;
      pcVar1 = "(1.0, 1.0, 1.0);\n";
      break;
    case TYPE_FLOAT_VEC4:
      lVar4 = 0x16;
      pcVar1 = "(1.0, 1.0, 1.0, 1.0);\n";
      break;
    default:
      goto switchD_005e7b56_default;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar1,lVar4);
switchD_005e7b56_default:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string declareAndInitializeShaderVariable (glu::DataType dataType, std::string varName)
{
	std::ostringstream variable;
	variable << getDataTypeName(dataType) << " " << varName << " = " << getDataTypeName(dataType);
	switch (dataType)
	{
		case glu::TYPE_FLOAT:		variable << "(1.0);\n";					break;
		case glu::TYPE_FLOAT_VEC2:	variable << "(1.0, 1.0);\n";			break;
		case glu::TYPE_FLOAT_VEC3:	variable << "(1.0, 1.0, 1.0);\n";		break;
		case glu::TYPE_FLOAT_VEC4:	variable << "(1.0, 1.0, 1.0, 1.0);\n";	break;
		case glu::TYPE_INT:			variable << "(1);\n";					break;
		case glu::TYPE_INT_VEC2:	variable << "(1, 1);\n";				break;
		case glu::TYPE_INT_VEC3:	variable << "(1, 1, 1);\n";				break;
		case glu::TYPE_INT_VEC4:	variable << "(1, 1, 1, 1);\n";			break;
		case glu::TYPE_UINT:		variable << "(1u);\n";					break;
		case glu::TYPE_UINT_VEC2:	variable << "(1u, 1u);\n";				break;
		case glu::TYPE_UINT_VEC3:	variable << "(1u, 1u, 1u);\n";			break;
		case glu::TYPE_UINT_VEC4:	variable << "(1u, 1u, 1u, 1u);\n";		break;
		default:
			DE_FATAL("Unsupported data type.");
	}
	return variable.str();
}